

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat4 *matrixArray,size_t length)

{
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var1;
  Mat4 *source;
  reference pvVar2;
  undefined1 local_78 [8];
  UniformBinder binder;
  size_t i;
  allocator<float> local_49;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> contiguous;
  size_t matrixSize;
  size_t length_local;
  Mat4 *matrixArray_local;
  string *name_local;
  Shader *this_local;
  
  contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x10;
  std::allocator<float>::allocator(&local_49);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_48,length << 4,&local_49);
  std::allocator<float>::~allocator(&local_49);
  binder.currentProgram = 0;
  binder.location = 0;
  for (; (ulong)binder._8_8_ < length; binder._8_8_ = binder._8_8_ + 1) {
    source = matrixArray + binder._8_8_;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,binder._8_8_ << 4);
    priv::copyMatrix(source->array,0x10,pvVar2);
  }
  UniformBinder::UniformBinder((UniformBinder *)local_78,this,name);
  p_Var1 = sf_ptrc_glUniformMatrix4fvARB;
  if (binder.savedProgram != 0xffffffff) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,0);
    (*p_Var1)(binder.savedProgram,(GLsizei)length,'\0',pvVar2);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                       ,0x293,
                       "GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0])"
                      );
  }
  UniformBinder::~UniformBinder((UniformBinder *)local_78);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat4* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 4 * 4;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0]));
}